

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TextFlow::Column::const_iterator::const_iterator(const_iterator *this,Column *column)

{
  this->m_column = column;
  this->m_lineStart = 0;
  this->m_lineLength = 0;
  *(undefined8 *)((long)&this->m_lineLength + 1) = 0;
  *(undefined8 *)((long)&this->m_parsedTo + 1) = 0;
  if (column->m_width <= column->m_indent) {
    __assert_fail("m_column.m_width > m_column.m_indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                  ,0x1b12,"Catch::TextFlow::Column::const_iterator::const_iterator(const Column &)")
    ;
  }
  if (column->m_initialIndent < column->m_width || column->m_initialIndent == 0xffffffffffffffff) {
    calcLength(this);
    if (this->m_lineLength == 0) {
      this->m_lineStart = (this->m_column->m_string)._M_string_length;
    }
    return;
  }
  __assert_fail("m_column.m_initialIndent == std::string::npos || m_column.m_width > m_column.m_initialIndent"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                ,0x1b14,"Catch::TextFlow::Column::const_iterator::const_iterator(const Column &)");
}

Assistant:

Column::const_iterator::const_iterator( Column const& column ): m_column( column ) {
            assert( m_column.m_width > m_column.m_indent );
            assert( m_column.m_initialIndent == std::string::npos ||
                    m_column.m_width > m_column.m_initialIndent );
            calcLength();
            if ( m_lineLength == 0 ) {
                m_lineStart = m_column.m_string.size();
            }
        }